

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_reader_options.cpp
# Opt level: O1

void __thiscall duckdb::CSVReaderOptions::SetEscape(CSVReaderOptions *this,string *input)

{
  pointer pcVar1;
  InvalidInputException *this_00;
  string escape_str;
  string local_68;
  char *local_48;
  ulong local_40;
  char local_38 [16];
  
  pcVar1 = (input->_M_dataplus)._M_p;
  local_48 = local_38;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + input->_M_string_length);
  if (local_40 < 2) {
    if (local_40 == 0) {
      local_68.field_2._M_allocated_capacity._0_2_ = 0;
      local_68._M_string_length = 1;
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      ::std::__cxx11::string::operator=((string *)&local_48,(string *)&local_68);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p);
      }
    }
    if ((this->dialect_options).state_machine_options.escape.set_by_user == false) {
      (this->dialect_options).state_machine_options.escape.value = *local_48;
      (this->dialect_options).state_machine_options.escape.set_by_user = true;
    }
    if (local_48 != local_38) {
      operator_delete(local_48);
    }
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"The escape option cannot exceed a size of 1 byte.","");
  InvalidInputException::InvalidInputException(this_00,&local_68);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void CSVReaderOptions::SetEscape(const string &input) {
	auto escape_str = input;
	if (escape_str.size() > 1) {
		throw InvalidInputException("The escape option cannot exceed a size of 1 byte.");
	}
	if (escape_str.empty()) {
		escape_str = string("\0", 1);
	}
	this->dialect_options.state_machine_options.escape.Set(escape_str[0]);
}